

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBToUV444Row_C(uint8_t *src_argb,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  uint8_t b;
  uint8_t g;
  uint8_t r;
  int iVar1;
  int in_ECX;
  undefined1 *in_RDX;
  undefined1 *in_RSI;
  uint8_t *in_RDI;
  uint8_t ar;
  uint8_t ag;
  uint8_t ab;
  int x;
  int local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  uint8_t *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    b = *local_8;
    g = local_8[1];
    r = local_8[2];
    iVar1 = libyuv::RGBToU(r,g,b);
    *local_10 = (char)iVar1;
    iVar1 = libyuv::RGBToV(r,g,b);
    *local_18 = (char)iVar1;
    local_8 = local_8 + 4;
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void ARGBToUV444Row_C(const uint8_t* src_argb,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t ab = src_argb[0];
    uint8_t ag = src_argb[1];
    uint8_t ar = src_argb[2];
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
    src_argb += 4;
    dst_u += 1;
    dst_v += 1;
  }
}